

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  ImVec4 *pIVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiWindow *window;
  ImGuiWindow *pIVar7;
  ImDrawListSplitter *this;
  ulong uVar8;
  ImGuiTableColumn *pIVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  int iVar12;
  ImGuiTableInstanceData *pIVar13;
  ImGuiTableTempData *pIVar14;
  ImGuiTable *pIVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  uint extraout_XMM0_Db;
  uint uVar21;
  uint extraout_XMM0_Dc;
  uint uVar22;
  uint extraout_XMM0_Dd;
  uint uVar23;
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  uint uVar28;
  uint uVar29;
  ImVec2 local_38;
  
  pIVar10 = GImGui;
  pIVar15 = GImGui->CurrentTable;
  if (pIVar15->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar15);
  }
  uVar28 = pIVar15->Flags;
  window = pIVar15->InnerWindow;
  pIVar7 = pIVar15->OuterWindow;
  pIVar14 = pIVar15->TempData;
  if (pIVar15->IsInsideRow == true) {
    TableEndRow(pIVar15);
  }
  if (((((uVar28 & 0x20) != 0) && (pIVar15->HoveredColumnBody != -1)) &&
      (bVar11 = IsAnyItemHovered(), !bVar11)) && (bVar11 = IsMouseReleased(1), bVar11)) {
    TableOpenContextMenu((int)pIVar15->HoveredColumnBody);
  }
  if ((long)pIVar15->InstanceCurrent == 0) {
    pIVar13 = &pIVar15->InstanceDataFirst;
  }
  else {
    pIVar13 = (pIVar15->InstanceDataExtra).Data + (long)pIVar15->InstanceCurrent + -1;
  }
  (window->DC).PrevLineSize = pIVar14->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar14->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar14->HostBackupCursorMaxPos;
  fVar3 = pIVar15->RowPosY2;
  if (window == pIVar7) {
    if ((uVar28 >> 0x11 & 1) == 0) {
      fVar27 = (pIVar15->OuterRect).Max.y;
      uVar18 = -(uint)(fVar3 <= fVar27);
      fVar27 = (float)(~uVar18 & (uint)fVar3 | (uint)fVar27 & uVar18);
      (pIVar15->InnerRect).Max.y = fVar27;
      (pIVar15->OuterRect).Max.y = fVar27;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar3;
  }
  fVar27 = (pIVar15->OuterRect).Max.y;
  fVar25 = (pIVar15->WorkRect).Max.y;
  uVar18 = -(uint)(fVar27 <= fVar25);
  (pIVar15->WorkRect).Max.y = (float)(~uVar18 & (uint)fVar27 | (uint)fVar25 & uVar18);
  pIVar13->LastOuterHeight = fVar27 - (pIVar15->OuterRect).Min.y;
  if (((uint)pIVar15->Flags >> 0x18 & 1) != 0) {
    fVar27 = (pIVar15->InnerWindow->DC).CursorMaxPos.x;
    if ((long)pIVar15->RightMostEnabledColumn != -1) {
      fVar25 = 0.0;
      if (((uint)pIVar15->Flags >> 10 & 1) != 0) {
        fVar25 = 1.0;
      }
      fVar25 = ((pIVar15->Columns).Data[pIVar15->RightMostEnabledColumn].WorkMaxX +
                pIVar15->CellPaddingX + pIVar15->OuterPaddingX) - fVar25;
      uVar18 = -(uint)(fVar25 <= fVar27);
      fVar27 = (float)(uVar18 & (uint)fVar27 | ~uVar18 & (uint)fVar25);
    }
    if (pIVar15->ResizedColumn != -1) {
      uVar18 = -(uint)(pIVar15->ResizeLockMinContentsX2 <= fVar27);
      fVar27 = (float)((uint)fVar27 & uVar18 | ~uVar18 & (uint)pIVar15->ResizeLockMinContentsX2);
    }
    (pIVar15->InnerWindow->DC).CursorMaxPos.x = fVar27;
  }
  if ((uVar28 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  pIVar2 = (window->DrawList->_ClipRectStack).Data +
           (long)(window->DrawList->_ClipRectStack).Size + -1;
  fVar27 = pIVar2->y;
  fVar25 = pIVar2->z;
  fVar26 = pIVar2->w;
  (window->ClipRect).Min.x = pIVar2->x;
  (window->ClipRect).Min.y = fVar27;
  (window->ClipRect).Max.x = fVar25;
  (window->ClipRect).Max.y = fVar26;
  if ((uVar28 & 0x780) != 0) {
    TableDrawBorders(pIVar15);
  }
  this = pIVar15->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this,window->DrawList,0);
  if ((pIVar15->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar15);
  }
  ImDrawListSplitter::Merge(this,window->DrawList);
  iVar12 = pIVar15->ColumnsCount;
  if ((long)iVar12 < 1) {
    fVar27 = 0.0;
    fVar25 = 0.0;
    fVar26 = 0.0;
  }
  else {
    uVar8 = pIVar15->EnabledMaskByIndex;
    fVar26 = 0.0;
    lVar16 = 0x18;
    uVar17 = 0;
    fVar25 = 0.0;
    fVar27 = 0.0;
    uVar28 = 0;
    uVar18 = 0;
    uVar29 = 0;
    do {
      if ((uVar8 >> (uVar17 & 0x3f) & 1) != 0) {
        pIVar9 = (pIVar15->Columns).Data;
        uVar19 = *(uint *)((long)pIVar9 + lVar16 + -0x18);
        if ((uVar19 & 0x30) == 0x10) {
          fVar20 = *(float *)((long)pIVar9 + lVar16 + -8);
          uVar21 = 0;
          uVar22 = 0;
          uVar23 = 0;
        }
        else {
          fVar20 = TableGetColumnWidthAuto
                             (pIVar15,(ImGuiTableColumn *)((long)pIVar9 + lVar16 + -0x18));
          uVar21 = extraout_XMM0_Db;
          uVar22 = extraout_XMM0_Dc;
          uVar23 = extraout_XMM0_Dd;
        }
        if ((uVar19 & 0x10) == 0) {
          fVar25 = fVar25 + fVar20;
        }
        else {
          fVar26 = fVar26 + fVar20;
        }
        if ((~uVar19 & 0x28) == 0) {
          fVar20 = fVar20 / (*(float *)((long)&pIVar9->Flags + lVar16) /
                            pIVar15->ColumnsStretchSumWeights);
          uVar19 = -(uint)(fVar20 <= fVar27);
          auVar24._0_4_ = uVar19 & (uint)fVar27;
          auVar24._4_4_ = uVar21 & uVar28;
          auVar24._8_4_ = uVar22 & uVar18;
          auVar24._12_4_ = uVar23 & uVar29;
          auVar24 = auVar24 | ZEXT416(~uVar19 & (uint)fVar20);
          fVar27 = auVar24._0_4_;
          uVar28 = auVar24._4_4_;
          uVar18 = auVar24._8_4_;
          uVar29 = auVar24._12_4_;
        }
      }
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + 0x68;
    } while ((long)iVar12 != uVar17);
  }
  fVar20 = pIVar15->CellPaddingX + pIVar15->CellPaddingX;
  pIVar15->ColumnsAutoFitWidth =
       (float)(~-(uint)(fVar27 <= fVar25) & (uint)fVar27 | (uint)fVar25 & -(uint)(fVar27 <= fVar25))
       + (float)(int)pIVar15->ColumnsEnabledCount * fVar20 +
         pIVar15->OuterPaddingX + pIVar15->OuterPaddingX +
         (float)(pIVar15->ColumnsEnabledCount + -1) *
         (pIVar15->CellSpacingX1 + pIVar15->CellSpacingX2) + fVar26;
  if ((window == pIVar7) || ((pIVar15->Flags & 0x1000000U) != 0)) {
    if ((((long)pIVar15->LastResizedColumn != -1) &&
        ((pIVar15->ResizedColumn == -1 && (window->ScrollbarX == true)))) &&
       (pIVar15->InstanceInteracted == pIVar15->InstanceCurrent)) {
      fVar20 = fVar20 + pIVar15->MinColumnWidth;
      fVar27 = (pIVar15->Columns).Data[pIVar15->LastResizedColumn].MaxX;
      if ((pIVar15->InnerClipRect).Min.x <= fVar27) {
        pIVar1 = &(pIVar15->InnerClipRect).Max;
        if (fVar27 < pIVar1->x || fVar27 == pIVar1->x) goto LAB_0022fc03;
        fVar20 = fVar20 + (fVar27 - (window->Pos).x);
      }
      else {
        fVar20 = (fVar27 - (window->Pos).x) - fVar20;
      }
      SetScrollFromPosX(window,fVar20,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_0022fc03:
  if (((long)pIVar15->ResizedColumn != -1) &&
     (pIVar15->InstanceCurrent == pIVar15->InstanceInteracted)) {
    pIVar15->ResizedColumnNextWidth =
         (float)(int)((((((pIVar10->IO).MousePos.x - (pIVar10->ActiveIdClickOffset).x) + 4.0) -
                       (pIVar15->Columns).Data[pIVar15->ResizedColumn].MinX) -
                      pIVar15->CellSpacingX1) - (pIVar15->CellPaddingX + pIVar15->CellPaddingX));
  }
  PopID();
  fVar27 = (pIVar7->DC).CursorMaxPos.x;
  fVar25 = (pIVar7->DC).CursorMaxPos.y;
  IVar5 = (pIVar14->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar14->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar5;
  IVar5 = (pIVar14->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar14->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar5;
  window->SkipItems = pIVar15->HostSkipItems;
  (pIVar7->DC).CursorPos = (pIVar15->OuterRect).Min;
  (pIVar7->DC).ItemWidth = pIVar14->HostBackupItemWidth;
  (pIVar7->DC).ItemWidthStack.Size = pIVar14->HostBackupItemWidthStackSize;
  (pIVar7->DC).ColumnsOffset.x = (pIVar14->HostBackupColumnsOffset).x;
  if (window == pIVar7) {
    IVar5 = (pIVar15->OuterRect).Min;
    IVar6 = (pIVar15->OuterRect).Max;
    local_38.x = IVar6.x - IVar5.x;
    local_38.y = IVar6.y - IVar5.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar15->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    EndChild();
  }
  if (((uint)pIVar15->Flags >> 0x10 & 1) == 0) {
    fVar26 = (pIVar14->UserOuterSize).x;
    fVar20 = 0.0;
    if (fVar26 <= 0.0) {
      if (((uint)pIVar15->Flags >> 0x18 & 1) != 0) {
        fVar20 = (window->ScrollbarSizes).x;
      }
      fVar4 = (pIVar7->DC).IdealMaxPos.x;
      fVar26 = ((pIVar15->OuterRect).Min.x + pIVar15->ColumnsAutoFitWidth + fVar20) - fVar26;
      uVar28 = -(uint)(fVar26 <= fVar4);
      (pIVar7->DC).IdealMaxPos.x = (float)(uVar28 & (uint)fVar4 | ~uVar28 & (uint)fVar26);
      fVar26 = (pIVar15->OuterRect).Max.x;
      fVar20 = (pIVar15->OuterRect).Min.x + pIVar15->ColumnsAutoFitWidth;
      if (fVar20 <= fVar26) {
        fVar26 = fVar20;
      }
    }
    else {
      fVar26 = (pIVar15->OuterRect).Max.x;
    }
  }
  else {
    fVar26 = (pIVar15->OuterRect).Min.x + pIVar15->ColumnsAutoFitWidth;
  }
  uVar28 = -(uint)(fVar26 <= fVar27);
  (pIVar7->DC).CursorMaxPos.x = (float)(~uVar28 & (uint)fVar26 | (uint)fVar27 & uVar28);
  fVar27 = (pIVar14->UserOuterSize).y;
  fVar26 = 0.0;
  if (fVar27 <= 0.0) {
    if ((pIVar15->Flags & 0x2000000) != 0) {
      fVar26 = (window->ScrollbarSizes).y;
    }
    fVar20 = (pIVar7->DC).IdealMaxPos.y;
    fVar27 = (fVar26 + fVar3) - fVar27;
    uVar28 = -(uint)(fVar27 <= fVar20);
    (pIVar7->DC).IdealMaxPos.y = (float)(uVar28 & (uint)fVar20 | ~uVar28 & (uint)fVar27);
    fVar27 = (pIVar15->OuterRect).Max.y;
    if (fVar3 <= fVar27) {
      fVar27 = fVar3;
    }
  }
  else {
    fVar27 = (pIVar15->OuterRect).Max.y;
  }
  uVar28 = -(uint)(fVar27 <= fVar25);
  (pIVar7->DC).CursorMaxPos.y = (float)(~uVar28 & (uint)fVar27 | (uint)fVar25 & uVar28);
  if (pIVar15->IsSettingsDirty == true) {
    TableSaveSettings(pIVar15);
  }
  pIVar15->IsInitializing = false;
  iVar12 = pIVar10->TablesTempDataStacked;
  pIVar10->TablesTempDataStacked = iVar12 + -1;
  if ((long)iVar12 < 2) {
    pIVar14 = (ImGuiTableTempData *)0x0;
  }
  else {
    pIVar14 = (pIVar10->TablesTempData).Data + (long)iVar12 + -2;
  }
  if (pIVar14 == (ImGuiTableTempData *)0x0) {
    pIVar15 = (ImGuiTable *)0x0;
  }
  else {
    pIVar15 = (pIVar10->Tables).Buf.Data + pIVar14->TableIndex;
  }
  pIVar10->CurrentTable = pIVar15;
  if (pIVar15 != (ImGuiTable *)0x0) {
    pIVar15->TempData = pIVar14;
    pIVar10->CurrentTable->DrawSplitter = &pIVar14->DrawSplitter;
  }
  if (pIVar10->CurrentTable == (ImGuiTable *)0x0) {
    iVar12 = -1;
  }
  else {
    iVar12 = (int)((ulong)((long)pIVar10->CurrentTable - (long)(pIVar10->Tables).Buf.Data) >> 3) *
             0x7a44c6b;
  }
  (pIVar7->DC).CurrentTableIdx = iVar12;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    float auto_fit_width_for_fixed = 0.0f;
    float auto_fit_width_for_stretched = 0.0f;
    float auto_fit_width_for_stretched_min = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            float column_width_request = ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize)) ? column->WidthRequest : TableGetColumnWidthAuto(table, column);
            if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
                auto_fit_width_for_fixed += column_width_request;
            else
                auto_fit_width_for_stretched += column_width_request;
            if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) && (column->Flags & ImGuiTableColumnFlags_NoResize) != 0)
                auto_fit_width_for_stretched_min = ImMax(auto_fit_width_for_stretched_min, column_width_request / (column->StretchWeight / table->ColumnsStretchSumWeights));
        }
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount + auto_fit_width_for_fixed + ImMax(auto_fit_width_for_stretched, auto_fit_width_for_stretched_min);

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}